

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

void __thiscall llvm::APFloat::makeInf(APFloat *this,bool Neg)

{
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::makeInf(&(this->U).IEEE,Neg);
    return;
  }
  makeInf((APFloat *)(this->U).IEEE.significand.parts,Neg);
  makeZero((APFloat *)((this->U).IEEE.significand.part + 0x20),false);
  return;
}

Assistant:

void makeInf(bool Neg) { APFLOAT_DISPATCH_ON_SEMANTICS(makeInf(Neg)); }